

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t parse_decoder_model_info(aom_read_bit_buffer *rb,int *buffer_delay_length_minus_1)

{
  int iVar1;
  uint32_t bits;
  aom_read_bit_buffer *in_RSI;
  uint8_t frame_presentation_time_length_minus_1;
  uint8_t buffer_removal_time_length_minus_1;
  uint32_t num_units_in_decoding_tick;
  int in_stack_ffffffffffffffec;
  
  iVar1 = aom_rb_read_literal(in_RSI,in_stack_ffffffffffffffec);
  *(int *)&in_RSI->bit_buffer = iVar1;
  bits = aom_rb_read_unsigned_literal(in_RSI,in_stack_ffffffffffffffec);
  aom_rb_read_literal(in_RSI,bits);
  aom_rb_read_literal(in_RSI,bits);
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t parse_decoder_model_info(
    struct aom_read_bit_buffer *rb, int *buffer_delay_length_minus_1) {
  *buffer_delay_length_minus_1 = aom_rb_read_literal(rb, 5);
  const uint32_t num_units_in_decoding_tick =
      aom_rb_read_unsigned_literal(rb, 32);
  const uint8_t buffer_removal_time_length_minus_1 = aom_rb_read_literal(rb, 5);
  const uint8_t frame_presentation_time_length_minus_1 =
      aom_rb_read_literal(rb, 5);
  (void)num_units_in_decoding_tick;
  (void)buffer_removal_time_length_minus_1;
  (void)frame_presentation_time_length_minus_1;
  return AOM_CODEC_OK;
}